

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::AtomicCounterTests::AtomicCounterTests
          (AtomicCounterTests *this,Context *context)

{
  Context *pCVar1;
  _Alloc_hider name;
  undefined8 uVar2;
  TestCaseGroup *pTVar3;
  AtomicCounterTest *pAVar4;
  TestCaseGroup *this_00;
  undefined1 useBranch;
  bool useBranch_00;
  int iVar5;
  ulong uVar6;
  TestSpec *spec;
  TestSpec *spec_00;
  long lVar7;
  TestSpec *spec_01;
  TestSpec *spec_02;
  Operation OVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  Operation operation;
  TestCaseGroup *local_240;
  Operation local_234;
  TestCaseGroup *local_230;
  long local_228;
  TestCaseGroup *local_220;
  AtomicCounterTest *local_218;
  long local_210;
  TestSpec local_208;
  string local_1e8;
  ulong local_1c8;
  TestCaseGroup *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,context,"atomic_counter","Atomic counter tests");
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AtomicCounterTests_01e50dc0;
  pTVar3 = (TestCaseGroup *)0x0;
  while (pTVar3 != (TestCaseGroup *)0x7) {
    operation = (&DAT_018996f0)[(long)pTVar3];
    uVar6 = (ulong)operation;
    local_1c0 = (TestCaseGroup *)CONCAT44(local_1c0._4_4_,operation);
    iVar11 = 0;
    local_230 = pTVar3;
    while( true ) {
      useBranch = (undefined1)uVar6;
      if (iVar11 == 2) break;
      local_1b0 = CONCAT71(local_1b0._1_7_,iVar11 == 1);
      local_240 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      Functional::(anonymous_namespace)::operationToName_abi_cxx11_
                ((string *)local_1a8,(_anonymous_namespace_ *)&operation,
                 (Operation *)(ulong)(iVar11 == 1),(bool)useBranch);
      uVar2 = local_1a8._0_8_;
      local_210 = CONCAT44(local_210._4_4_,iVar11);
      Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
                (&local_1e8,(_anonymous_namespace_ *)&operation,(Operation *)(ulong)(iVar11 == 1),
                 (bool)useBranch);
      TestCaseGroup::TestCaseGroup(local_240,pCVar1,(char *)uVar2,local_1e8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)local_1a8);
      uVar10 = (uint)local_210 ^ 1;
      local_1b8 = CONCAT44(local_1b8._4_4_,(uint)local_210) ^ 1;
      uVar6 = 0;
      while (uVar6 != 3) {
        OVar8 = (&DAT_018996c0)[uVar6];
        lVar7 = 0;
        local_234 = OVar8;
        local_1c8 = uVar6;
        while (lVar7 != 3) {
          iVar11 = (&DAT_018996cc)[lVar7];
          local_220 = (TestCaseGroup *)CONCAT44(local_220._4_4_,iVar11);
          local_228 = lVar7;
          for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 4) {
            iVar5 = *(int *)((long)&DAT_018996d8 + lVar9) * iVar11;
            if (((int)(iVar5 * OVar8) < 0x2711) && (iVar5 != 1 || uVar10 != 0)) {
              local_208.operations = (Operation)local_1c0;
              local_208.useBranches = (bool)(undefined1)local_1b0;
              local_208.offsetType = OFFSETTYPE_NONE;
              local_208.bindingType = BINDINGTYPE_BASIC;
              local_208.atomicCounterCount = OVar8;
              local_208.callCount = iVar11;
              local_208.threadCount = *(int *)((long)&DAT_018996d8 + lVar9);
              local_218 = (AtomicCounterTest *)operator_new(0x98);
              pCVar1 = (this->super_TestCaseGroup).m_context;
              Functional::(anonymous_namespace)::specToTestName_abi_cxx11_
                        ((string *)local_1a8,(_anonymous_namespace_ *)&local_208,spec);
              uVar2 = local_1a8._0_8_;
              Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
                        (&local_1e8,(_anonymous_namespace_ *)&local_208,spec_00);
              pAVar4 = local_218;
              Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
                        (local_218,pCVar1,(char *)uVar2,local_1e8._M_dataplus._M_p,&local_208);
              tcu::TestNode::addChild((TestNode *)local_240,(TestNode *)pAVar4);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)local_1a8);
              uVar10 = (uint)local_1b8;
              OVar8 = local_234;
              iVar11 = (int)local_220;
            }
          }
          lVar7 = local_228 + 1;
        }
        uVar6 = local_1c8 + 1;
      }
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)local_240);
      iVar11 = (uint)local_210 + 1;
    }
    pTVar3 = (TestCaseGroup *)
             ((long)&(local_230->super_TestCaseGroup).super_TestNode._vptr_TestNode + 1);
  }
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"layout","Layout qualifier tests.");
  local_1c0 = pTVar3;
  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
    local_240 = (TestCaseGroup *)(ulong)(uint)(&DAT_017594c0)[uVar6];
    local_230 = (TestCaseGroup *)operator_new(0x78);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    uVar10 = (int)local_240 - 1;
    if (uVar10 < 6) {
      std::operator<<((ostream *)local_1a8,
                      &DAT_01899784 + *(int *)(&DAT_01899784 + (ulong)uVar10 * 4));
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    name._M_p = local_1e8._M_dataplus._M_p;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "Test using atomic counters with explicit layout bindings and");
    std::operator<<((ostream *)local_1a8,
                    &DAT_0189979c + *(int *)(&DAT_0189979c + (long)(int)local_240 * 4));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    TestCaseGroup::TestCaseGroup
              (local_230,pCVar1,name._M_p,
               (char *)CONCAT44(local_208.operations,local_208.atomicCounterCount));
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    local_1c8 = uVar6 ^ 1;
    lVar7 = 0;
    local_1b8 = uVar6;
    while (lVar7 != 3) {
      operation = (&DAT_0189970c)[lVar7];
      local_234 = operation;
      local_210 = lVar7;
      local_220 = (TestCaseGroup *)operator_new(0x78);
      pCVar1 = (this->super_TestCaseGroup).m_context;
      useBranch_00 = SUB81(lVar7,0);
      Functional::(anonymous_namespace)::operationToName_abi_cxx11_
                ((string *)local_1a8,(_anonymous_namespace_ *)&operation,(Operation *)0x0,
                 useBranch_00);
      uVar2 = local_1a8._0_8_;
      Functional::(anonymous_namespace)::operationToDescription_abi_cxx11_
                (&local_1e8,(_anonymous_namespace_ *)&operation,(Operation *)0x0,useBranch_00);
      TestCaseGroup::TestCaseGroup(local_220,pCVar1,(char *)uVar2,local_1e8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)local_1a8);
      lVar7 = 0;
      while (lVar7 != 2) {
        local_228 = lVar7;
        if (((local_1c8 != 0 || lVar7 != 0) && (uVar6 < 2 || lVar7 != 0)) &&
           ((int)lVar7 != 0 || (int)uVar6 != 0)) {
          local_218 = (AtomicCounterTest *)
                      CONCAT44(local_218._4_4_,*(undefined4 *)(&DAT_0189a3fc + lVar7 * 4));
          lVar7 = 0;
          while (lVar7 != 2) {
            iVar11 = (&DAT_0189a404)[lVar7];
            local_1b0 = lVar7;
            for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 4) {
              local_208.threadCount = *(int *)((long)&DAT_0189a40c + lVar9);
              local_208.atomicCounterCount = (Operation)local_218;
              local_208.operations = local_234;
              local_208.useBranches = false;
              local_208._20_8_ = (ulong)local_240 & 0xffffffff;
              local_208.callCount = iVar11;
              pAVar4 = (AtomicCounterTest *)operator_new(0x98);
              pCVar1 = (this->super_TestCaseGroup).m_context;
              Functional::(anonymous_namespace)::specToTestName_abi_cxx11_
                        ((string *)local_1a8,(_anonymous_namespace_ *)&local_208,spec_01);
              uVar2 = local_1a8._0_8_;
              Functional::(anonymous_namespace)::specToTestDescription_abi_cxx11_
                        (&local_1e8,(_anonymous_namespace_ *)&local_208,spec_02);
              Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
                        (pAVar4,pCVar1,(char *)uVar2,local_1e8._M_dataplus._M_p,&local_208);
              tcu::TestNode::addChild((TestNode *)local_220,(TestNode *)pAVar4);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)local_1a8);
            }
            pTVar3 = local_1c0;
            uVar6 = local_1b8;
            lVar7 = local_1b0 + 1;
          }
        }
        lVar7 = local_228 + 1;
      }
      tcu::TestNode::addChild((TestNode *)local_230,(TestNode *)local_220);
      lVar7 = local_210 + 1;
    }
    tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)local_230);
  }
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"invalid","Test invalid layouts");
  local_1a8._0_8_ = &DAT_100000001;
  local_1a8._8_4_ = 1;
  local_1a8[0xc] = false;
  local_198[0]._M_allocated_capacity = 1;
  local_198[0]._8_4_ = local_1a8._8_4_;
  pAVar4 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar4,(this->super_TestCaseGroup).m_context,"invalid_binding",
             "Test layout qualifiers with invalid binding.",(TestSpec *)local_1a8);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pAVar4);
  local_1a8._0_8_ = &DAT_100000001;
  local_1a8._8_4_ = 1;
  local_1a8[0xc] = false;
  local_198[0]._M_allocated_capacity = 1;
  local_198[0]._8_4_ = 2;
  pAVar4 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar4,(this->super_TestCaseGroup).m_context,"invalid_default_binding",
             "Test layout qualifiers with invalid default binding.",(TestSpec *)local_1a8);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pAVar4);
  local_1a8._0_8_ = &DAT_100000001;
  local_1a8._8_4_ = 1;
  local_1a8[0xc] = false;
  local_198[0]._M_allocated_capacity = &DAT_600000001;
  local_198[0]._8_4_ = 0;
  pAVar4 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar4,(this->super_TestCaseGroup).m_context,"invalid_offset_align",
             "Test layout qualifiers with invalid alignment offset.",(TestSpec *)local_1a8);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pAVar4);
  local_1a8._0_8_ = (pointer)0x100000002;
  local_1a8._8_4_ = 1;
  local_1a8[0xc] = false;
  local_198[0]._M_allocated_capacity = 0x700000001;
  local_198[0]._8_4_ = 0;
  pAVar4 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar4,(this->super_TestCaseGroup).m_context,"invalid_offset_overlap",
             "Test layout qualifiers with invalid overlapping offset.",(TestSpec *)local_1a8);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pAVar4);
  local_1a8._0_8_ = &DAT_100000001;
  local_1a8._8_4_ = 1;
  local_1a8[0xc] = false;
  local_198[0]._M_allocated_capacity = 0x800000001;
  local_198[0]._8_4_ = 0;
  pAVar4 = (AtomicCounterTest *)operator_new(0x98);
  Functional::anon_unknown_0::AtomicCounterTest::AtomicCounterTest
            (pAVar4,(this->super_TestCaseGroup).m_context,"invalid_default_offset",
             "Test layout qualifiers with invalid default offset.",(TestSpec *)local_1a8);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pAVar4);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  return;
}

Assistant:

AtomicCounterTests::AtomicCounterTests (Context& context)
	: TestCaseGroup(context, "atomic_counter", "Atomic counter tests")
{
	// Runtime use tests
	{
		const int counterCounts[] =
		{
			1, 4, 8
		};

		const int callCounts[] =
		{
			1, 5, 100
		};

		const int threadCounts[] =
		{
			1, 10, 5000
		};

		const AtomicCounterTest::Operation operations[] =
		{
			AtomicCounterTest::OPERATION_GET,
			AtomicCounterTest::OPERATION_INC,
			AtomicCounterTest::OPERATION_DEC,

			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET),

			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET)
		};

		for (int operationNdx = 0; operationNdx < DE_LENGTH_OF_ARRAY(operations); operationNdx++)
		{
			const AtomicCounterTest::Operation operation = operations[operationNdx];

			for (int branch = 0; branch < 2; branch++)
			{
				const bool useBranch = (branch == 1);

				TestCaseGroup* operationGroup = new TestCaseGroup(m_context, operationToName(operation, useBranch).c_str(), operationToDescription(operation, useBranch).c_str());

				for (int counterCountNdx = 0; counterCountNdx < DE_LENGTH_OF_ARRAY(counterCounts); counterCountNdx++)
				{
					const int counterCount = counterCounts[counterCountNdx];

					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); callCountNdx++)
					{
						const int callCount = callCounts[callCountNdx];

						for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
						{
							const int threadCount = threadCounts[threadCountNdx];

							if (threadCount * callCount * counterCount > 10000)
								continue;

							if (useBranch && threadCount * callCount == 1)
								continue;

							AtomicCounterTest::TestSpec spec;

							spec.atomicCounterCount = counterCount;
							spec.operations			= operation;
							spec.callCount			= callCount;
							spec.useBranches		= useBranch;
							spec.threadCount		= threadCount;
							spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
							spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

							operationGroup->addChild(new AtomicCounterTest(m_context, specToTestName(spec).c_str(), specToTestDescription(spec).c_str(), spec));
						}
					}
				}

				addChild(operationGroup);
			}
		}
	}

	{
		TestCaseGroup* layoutGroup = new TestCaseGroup(m_context, "layout", "Layout qualifier tests.");

		const int counterCounts[]	= { 1, 8 };
		const int callCounts[]		= { 1, 5 };
		const int threadCounts[]	= { 1, 1000 };

		const AtomicCounterTest::Operation operations[] =
		{
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_DEC|AtomicCounterTest::OPERATION_GET),
			(AtomicCounterTest::Operation)(AtomicCounterTest::OPERATION_INC|AtomicCounterTest::OPERATION_DEC)
		};

		const AtomicCounterTest::OffsetType offsetTypes[] =
		{
			AtomicCounterTest::OFFSETTYPE_REVERSE,
			AtomicCounterTest::OFFSETTYPE_FIRST_AUTO,
			AtomicCounterTest::OFFSETTYPE_DEFAULT_AUTO,
			AtomicCounterTest::OFFSETTYPE_RESET_DEFAULT
		};

		for (int offsetTypeNdx = 0; offsetTypeNdx < DE_LENGTH_OF_ARRAY(offsetTypes); offsetTypeNdx++)
		{
			const AtomicCounterTest::OffsetType offsetType = offsetTypes[offsetTypeNdx];

			TestCaseGroup* layoutQualifierGroup = new TestCaseGroup(m_context, layoutTypesToName(AtomicCounterTest::BINDINGTYPE_BASIC, offsetType).c_str(), layoutTypesToDesc(AtomicCounterTest::BINDINGTYPE_BASIC, offsetType).c_str());

			for (int operationNdx = 0; operationNdx < DE_LENGTH_OF_ARRAY(operations); operationNdx++)
			{
				const AtomicCounterTest::Operation operation = operations[operationNdx];

				TestCaseGroup* operationGroup = new TestCaseGroup(m_context, operationToName(operation, false).c_str(), operationToDescription(operation, false).c_str());

				for (int counterCountNdx = 0; counterCountNdx < DE_LENGTH_OF_ARRAY(counterCounts); counterCountNdx++)
				{
					const int counterCount = counterCounts[counterCountNdx];

					if (offsetType == AtomicCounterTest::OFFSETTYPE_FIRST_AUTO && counterCount < 3)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_DEFAULT_AUTO && counterCount < 2)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_RESET_DEFAULT && counterCount < 2)
						continue;

					if (offsetType == AtomicCounterTest::OFFSETTYPE_REVERSE && counterCount < 2)
						continue;

					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); callCountNdx++)
					{
						const int callCount = callCounts[callCountNdx];

						for (int threadCountNdx = 0; threadCountNdx < DE_LENGTH_OF_ARRAY(threadCounts); threadCountNdx++)
						{
							const int threadCount = threadCounts[threadCountNdx];

							AtomicCounterTest::TestSpec spec;

							spec.atomicCounterCount = counterCount;
							spec.operations			= operation;
							spec.callCount			= callCount;
							spec.useBranches		= false;
							spec.threadCount		= threadCount;
							spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
							spec.offsetType			= offsetType;

							operationGroup->addChild(new AtomicCounterTest(m_context, specToTestName(spec).c_str(), specToTestDescription(spec).c_str(), spec));
						}
					}
				}
				layoutQualifierGroup->addChild(operationGroup);
			}
			layoutGroup->addChild(layoutQualifierGroup);
		}

		{
			TestCaseGroup* invalidGroup = new TestCaseGroup(m_context, "invalid", "Test invalid layouts");

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_INVALID;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_binding", "Test layout qualifiers with invalid binding.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_INVALID_DEFAULT;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_NONE;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_default_binding", "Test layout qualifiers with invalid default binding.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_offset_align", "Test layout qualifiers with invalid alignment offset.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 2;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID_OVERLAPPING;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_offset_overlap", "Test layout qualifiers with invalid overlapping offset.", spec));
			}

			{
				AtomicCounterTest::TestSpec spec;

				spec.atomicCounterCount = 1;
				spec.operations			= AtomicCounterTest::OPERATION_INC;
				spec.callCount			= 1;
				spec.useBranches		= false;
				spec.threadCount		= 1;
				spec.bindingType		= AtomicCounterTest::BINDINGTYPE_BASIC;
				spec.offsetType			= AtomicCounterTest::OFFSETTYPE_INVALID_DEFAULT;

				invalidGroup->addChild(new AtomicCounterTest(m_context, "invalid_default_offset", "Test layout qualifiers with invalid default offset.", spec));
			}

			layoutGroup->addChild(invalidGroup);
		}

		addChild(layoutGroup);
	}
}